

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::SyncDirIfManifest(PosixWritableFile *this)

{
  char *__file;
  int *piVar1;
  long in_RSI;
  undefined1 local_48 [36];
  int local_24;
  int fd;
  PosixWritableFile *this_local;
  Status *status;
  
  fd._3_1_ = 0;
  this_local = this;
  Status::Status((Status *)this);
  if ((*(byte *)(in_RSI + 0x10014) & 1) != 0) {
    __file = (char *)std::__cxx11::string::c_str();
    local_24 = open(__file,0x80000);
    if (local_24 < 0) {
      piVar1 = __errno_location();
      PosixError((anon_unknown_1 *)(local_48 + 8),(string *)(in_RSI + 0x10038),*piVar1);
      Status::operator=((Status *)this,(Status *)(local_48 + 8));
      Status::~Status((Status *)(local_48 + 8));
    }
    else {
      SyncFd((PosixWritableFile *)local_48,local_24,(string *)(in_RSI + 0x10038));
      Status::operator=((Status *)this,(Status *)local_48);
      Status::~Status((Status *)local_48);
      close(local_24);
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status SyncDirIfManifest() {
    Status status;
    if (!is_manifest_) {
      return status;
    }

    int fd = ::open(dirname_.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      status = PosixError(dirname_, errno);
    } else {
      status = SyncFd(fd, dirname_);
      ::close(fd);
    }
    return status;
  }